

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solid.cpp
# Opt level: O0

ssize_t __thiscall MeshLib::Solid::read(Solid *this,int __fd,void *__buf,size_t __nbytes)

{
  double dVar1;
  undefined4 uVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  long *plVar6;
  size_t sVar7;
  double *pdVar8;
  Point *pPVar9;
  int *piVar10;
  string_token_iterator *psVar11;
  char *pcVar12;
  string *psVar13;
  ssize_t extraout_RAX;
  undefined4 in_register_00000034;
  bool local_b09;
  string local_b00 [32];
  int local_ae0;
  int local_adc;
  int ep_3;
  int sp_3;
  tHalfEdge local_ab8;
  tHalfEdge he;
  Face *f_1;
  Vertex *v_2;
  undefined1 local_a98 [4];
  int id1_1;
  int local_a74;
  undefined1 local_a70 [4];
  int id0_1;
  string local_a50 [32];
  int local_a30;
  int local_a2c;
  int ep_2;
  int sp_2;
  tEdge local_a08;
  tEdge edge;
  undefined1 local_9f8 [4];
  int id1;
  int local_9d4;
  undefined1 local_9d0 [4];
  int id0;
  string local_9b0 [32];
  int local_990;
  int local_98c;
  int ep_1;
  int sp_1;
  tFace f;
  int local_960;
  int local_95c;
  int i_1;
  int v_1 [3];
  string local_928 [32];
  int local_908;
  int local_904;
  int ep;
  int sp;
  tVertex v;
  int local_8d4;
  undefined1 auStack_8d0 [4];
  int i;
  Point p;
  undefined1 local_898 [8];
  string str;
  string_token_iterator iter;
  allocator local_841;
  undefined1 local_840 [8];
  string s;
  char local_818 [4];
  int id;
  char line [2048];
  istream *is_local;
  Solid *this_local;
  
  line._2044_4_ = in_register_00000034;
  line._2040_4_ = __fd;
  while( true ) {
    bVar3 = std::ios::operator_cast_to_bool
                      ((ios *)(line._2040_8_ + *(long *)(*(long *)line._2040_8_ + -0x18)));
    local_b09 = false;
    if (bVar3) {
      uVar4 = std::ios::eof();
      local_b09 = false;
      if ((uVar4 & 1) == 0) {
        plVar6 = (long *)std::istream::getline((char *)line._2040_8_,(long)local_818);
        local_b09 = std::ios::operator_cast_to_bool
                              ((ios *)((long)plVar6 + *(long *)(*plVar6 + -0x18)));
      }
    }
    if (local_b09 == false) break;
    sVar7 = strlen(local_818);
    if (sVar7 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)local_840,local_818,&local_841);
      std::allocator<char>::~allocator((allocator<char> *)&local_841);
      string_token_iterator::string_token_iterator
                ((string_token_iterator *)((long)&str.field_2 + 8),(string *)local_840," \n");
      string_token_iterator::operator*[abi_cxx11_
                ((string *)local_898,(string_token_iterator *)((long)&str.field_2 + 8));
      bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_898,"Vertex");
      if (bVar3) {
        psVar11 = string_token_iterator::operator++
                            ((string_token_iterator *)((long)&str.field_2 + 8));
        string_token_iterator::operator*[abi_cxx11_((string *)(p.v + 2),psVar11);
        std::__cxx11::string::operator=((string *)local_898,(string *)(p.v + 2));
        std::__cxx11::string::~string((string *)(p.v + 2));
        pcVar12 = (char *)std::__cxx11::string::c_str();
        s.field_2._12_4_ = atoi(pcVar12);
        Point::Point((Point *)auStack_8d0);
        for (local_8d4 = 0; local_8d4 < 3; local_8d4 = local_8d4 + 1) {
          psVar11 = string_token_iterator::operator++
                              ((string_token_iterator *)((long)&str.field_2 + 8));
          string_token_iterator::operator*[abi_cxx11_((string *)&v,psVar11);
          std::__cxx11::string::operator=((string *)local_898,(string *)&v);
          std::__cxx11::string::~string((string *)&v);
          pcVar12 = (char *)std::__cxx11::string::c_str();
          dVar1 = atof(pcVar12);
          pdVar8 = Point::operator[]((Point *)auStack_8d0,local_8d4);
          *pdVar8 = dVar1;
        }
        _ep = createVertex(this,s.field_2._12_4_);
        pPVar9 = Vertex::point(_ep);
        uVar2 = s.field_2._12_4_;
        pPVar9->v[2] = p.v[1];
        pPVar9->v[0] = _auStack_8d0;
        pPVar9->v[1] = p.v[0];
        piVar10 = Vertex::id(_ep);
        *piVar10 = uVar2;
        local_904 = std::__cxx11::string::find(local_840,0x133748);
        local_908 = std::__cxx11::string::find(local_840,0x13379e);
        if ((-1 < local_904) && (-1 < local_908)) {
          std::__cxx11::string::substr((ulong)local_928,(ulong)local_840);
          psVar13 = Vertex::string_abi_cxx11_(_ep);
          std::__cxx11::string::operator=((string *)psVar13,local_928);
          std::__cxx11::string::~string(local_928);
        }
        Point::~Point((Point *)auStack_8d0);
      }
      else {
        bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_898,"Face");
        if (bVar3) {
          psVar11 = string_token_iterator::operator++
                              ((string_token_iterator *)((long)&str.field_2 + 8));
          string_token_iterator::operator*[abi_cxx11_((string *)(v_1 + 1),psVar11);
          std::__cxx11::string::operator=((string *)local_898,(string *)(v_1 + 1));
          std::__cxx11::string::~string((string *)(v_1 + 1));
          pcVar12 = (char *)std::__cxx11::string::c_str();
          s.field_2._12_4_ = atoi(pcVar12);
          for (local_960 = 0; local_960 < 3; local_960 = local_960 + 1) {
            psVar11 = string_token_iterator::operator++
                                ((string_token_iterator *)((long)&str.field_2 + 8));
            string_token_iterator::operator*[abi_cxx11_((string *)&f,psVar11);
            std::__cxx11::string::operator=((string *)local_898,(string *)&f);
            std::__cxx11::string::~string((string *)&f);
            pcVar12 = (char *)std::__cxx11::string::c_str();
            iVar5 = atoi(pcVar12);
            (&local_95c)[local_960] = iVar5;
          }
          _ep_1 = createFace(this,&local_95c,s.field_2._12_4_);
          local_98c = std::__cxx11::string::find(local_840,0x133748);
          local_990 = std::__cxx11::string::find(local_840,0x13379e);
          if ((-1 < local_98c) && (-1 < local_990)) {
            std::__cxx11::string::substr((ulong)local_9b0,(ulong)local_840);
            psVar13 = Face::string_abi_cxx11_(_ep_1);
            std::__cxx11::string::operator=((string *)psVar13,local_9b0);
            std::__cxx11::string::~string(local_9b0);
          }
        }
        else {
          bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_898,"Edge");
          if (bVar3) {
            psVar11 = string_token_iterator::operator++
                                ((string_token_iterator *)((long)&str.field_2 + 8));
            string_token_iterator::operator*[abi_cxx11_((string *)local_9d0,psVar11);
            std::__cxx11::string::operator=((string *)local_898,(string *)local_9d0);
            std::__cxx11::string::~string((string *)local_9d0);
            pcVar12 = (char *)std::__cxx11::string::c_str();
            local_9d4 = atoi(pcVar12);
            psVar11 = string_token_iterator::operator++
                                ((string_token_iterator *)((long)&str.field_2 + 8));
            string_token_iterator::operator*[abi_cxx11_((string *)local_9f8,psVar11);
            std::__cxx11::string::operator=((string *)local_898,(string *)local_9f8);
            std::__cxx11::string::~string((string *)local_9f8);
            pcVar12 = (char *)std::__cxx11::string::c_str();
            edge._4_4_ = atoi(pcVar12);
            local_a08 = idEdge(this,local_9d4,edge._4_4_);
            psVar11 = string_token_iterator::operator++
                                ((string_token_iterator *)((long)&str.field_2 + 8));
            string_token_iterator::operator*[abi_cxx11_((string *)&ep_2,psVar11);
            std::__cxx11::string::operator=((string *)local_898,(string *)&ep_2);
            std::__cxx11::string::~string((string *)&ep_2);
            local_a2c = std::__cxx11::string::find(local_840,0x133748);
            local_a30 = std::__cxx11::string::find(local_840,0x13379e);
            if ((-1 < local_a2c) && (-1 < local_a30)) {
              std::__cxx11::string::substr((ulong)local_a50,(ulong)local_840);
              psVar13 = Edge::string_abi_cxx11_(local_a08);
              std::__cxx11::string::operator=((string *)psVar13,local_a50);
              std::__cxx11::string::~string(local_a50);
            }
          }
          else {
            bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_898,"Corner");
            if (bVar3) {
              psVar11 = string_token_iterator::operator++
                                  ((string_token_iterator *)((long)&str.field_2 + 8));
              string_token_iterator::operator*[abi_cxx11_((string *)local_a70,psVar11);
              std::__cxx11::string::operator=((string *)local_898,(string *)local_a70);
              std::__cxx11::string::~string((string *)local_a70);
              pcVar12 = (char *)std::__cxx11::string::c_str();
              local_a74 = atoi(pcVar12);
              psVar11 = string_token_iterator::operator++
                                  ((string_token_iterator *)((long)&str.field_2 + 8));
              string_token_iterator::operator*[abi_cxx11_((string *)local_a98,psVar11);
              std::__cxx11::string::operator=((string *)local_898,(string *)local_a98);
              std::__cxx11::string::~string((string *)local_a98);
              pcVar12 = (char *)std::__cxx11::string::c_str();
              v_2._4_4_ = atoi(pcVar12);
              f_1 = (Face *)idVertex(this,local_a74);
              he = (tHalfEdge)idFace(this,v_2._4_4_);
              local_ab8 = corner(this,(tVertex)f_1,(tFace)he);
              psVar11 = string_token_iterator::operator++
                                  ((string_token_iterator *)((long)&str.field_2 + 8));
              string_token_iterator::operator*[abi_cxx11_((string *)&ep_3,psVar11);
              std::__cxx11::string::operator=((string *)local_898,(string *)&ep_3);
              std::__cxx11::string::~string((string *)&ep_3);
              local_adc = std::__cxx11::string::find(local_840,0x133748);
              local_ae0 = std::__cxx11::string::find(local_840,0x13379e);
              if ((-1 < local_adc) && (-1 < local_ae0)) {
                std::__cxx11::string::substr((ulong)local_b00,(ulong)local_840);
                psVar13 = HalfEdge::string_abi_cxx11_(local_ab8);
                std::__cxx11::string::operator=((string *)psVar13,local_b00);
                std::__cxx11::string::~string(local_b00);
              }
            }
          }
        }
      }
      std::__cxx11::string::~string((string *)local_898);
      std::__cxx11::string::~string((string *)local_840);
    }
  }
  labelBoundaryEdges(this);
  removeDanglingVertices(this);
  return extraout_RAX;
}

Assistant:

void Solid::read( std::istream & is ) {
	char line[MAX_LINE];
	int id;

	while( is && !is.eof() && is.getline(line, MAX_LINE) )
	{		
		if( strlen( line ) == 0 ) continue;

		std::string s(line);

		string_token_iterator iter(s, " \n"); 
		
		std::string str = *iter;

		if( str == "Vertex" ) 
		{
			
			str = *(++iter);

			id = atoi( str.c_str() );


			Point p;
			for( int i = 0 ; i < 3; i ++ )
			{
				str = *(++iter);
				p[i] = atof( str.c_str() );
			}
		
			tVertex v  = createVertex( id );
			
			v->point() = p;
			v->id()    = id;

			int sp = (int)s.find("{");
			int ep = (int)s.find("}");

			if( sp >= 0 && ep >= 0 )
			{
				v->string() = s.substr( sp+1, ep-sp-1 );
			}

			continue;

		}

		if( str == "Face" ) {
			str = *(++iter);

			id = atoi( str.c_str() );
	
			int v[3];
			for( int i = 0; i < 3; i ++ ) {
				str = *(++iter);
				v[i] = atoi( str.c_str() );
			}

			tFace f = createFace( v, id );
			

			int sp = (int)s.find("{");
			int ep = (int)s.find("}");

			if( sp >= 0 && ep >= 0 )
			{
				f->string() = s.substr( sp+1, ep-sp-1 );
			}
			continue;
		}

		//read in edge attributes
		if( str == "Edge" )
		{
			str = *(++iter);
			int id0 = atoi( str.c_str() );

			str = *(++iter);
			int id1 = atoi( str.c_str() );

			tEdge edge = idEdge( id0, id1 );
			
			str = *(++iter);

			int sp = (int)s.find("{");
			int ep = (int)s.find("}");

			if( sp >= 0 && ep >= 0 )
			{
				edge->string() = s.substr( sp+1, ep-sp-1 );
			}
			
			continue;

		}

		//read in edge attributes
		if( str == "Corner" ) 
		{
			str = *(++iter);
			int id0 = atoi( str.c_str() );
				
			str = *(++iter);
			int id1 = atoi( str.c_str() );


			Vertex * v = idVertex( id0 );
			Face   * f = idFace( id1 );
			tHalfEdge he = corner( v, f );

			str = *(++iter);

			int sp = (int)s.find("{");
			int ep = (int)s.find("}");

			if( sp >= 0 && ep >= 0 )
			{
				he->string() = s.substr( sp+1, ep-sp-1 );
			}
			continue;
		}


	}

	labelBoundaryEdges();

	removeDanglingVertices();

}